

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitFromImage::prepare
          (ImageBlitFromImage *this,PrepareContext *context)

{
  VkImageLayout *this_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  RefData<vk::Handle<(vk::HandleType)7>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  RefData<vk::Handle<(vk::HandleType)7>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  deUint8 dVar3;
  deInt32 dVar4;
  VkResult result;
  Context *pCVar5;
  InstanceInterface *vki_00;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  VkDevice device_00;
  VkQueue queue_00;
  VkCommandPool pool;
  VkDeviceSize VVar6;
  size_type sVar7;
  Handle<(vk::HandleType)9> *pHVar8;
  Handle<(vk::HandleType)8> *pHVar9;
  Handle<(vk::HandleType)7> *pHVar10;
  void *pvVar11;
  VkCommandBuffer_s **ppVVar12;
  ulong local_380;
  size_t ndx;
  deUint8 *data;
  Random rng;
  void *ptr;
  VkBufferImageCopy region;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  Move<vk::VkCommandBuffer_s_*> local_280;
  RefData<vk::VkCommandBuffer_s_*> local_260;
  undefined1 local_240 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  Move<vk::Handle<(vk::HandleType)7>_> local_218;
  RefData<vk::Handle<(vk::HandleType)7>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> memory;
  RefData<vk::Handle<(vk::HandleType)8>_> local_198;
  undefined1 local_178 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> srcBuffer;
  Move<vk::Handle<(vk::HandleType)7>_> local_150;
  RefData<vk::Handle<(vk::HandleType)7>_> local_130;
  Move<vk::Handle<(vk::HandleType)9>_> local_100;
  RefData<vk::Handle<(vk::HandleType)9>_> local_e0;
  undefined1 local_c0 [8];
  VkImageCreateInfo createInfo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  VkCommandPool commandPool;
  VkQueue queue;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  PrepareContext *context_local;
  ImageBlitFromImage *this_local;
  
  pCVar5 = PrepareContext::getContext(context);
  vki_00 = Context::getInstanceInterface(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  vk = Context::getDeviceInterface(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  physicalDevice_00 = Context::getPhysicalDevice(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  device_00 = Context::getDevice(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  queue_00 = Context::getQueue(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  pool = Context::getCommandPool(pCVar5);
  pCVar5 = PrepareContext::getContext(context);
  Context::getQueueFamilies
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&createInfo.initialLayout,pCVar5
            );
  this_00 = &createInfo.initialLayout;
  dVar4 = PrepareContext::getImageWidth(context);
  this->m_imageWidth = dVar4;
  dVar4 = PrepareContext::getImageHeight(context);
  this->m_imageHeight = dVar4;
  VVar6 = PrepareContext::getImageMemorySize(context);
  this->m_imageMemorySize = VVar6;
  if (this->m_scale == BLIT_SCALE_10) {
    this->m_srcImageWidth = this->m_imageWidth;
    this->m_srcImageHeight = this->m_imageHeight;
  }
  else if (this->m_scale == BLIT_SCALE_20) {
    this->m_srcImageWidth = this->m_imageWidth / 2;
    this->m_srcImageHeight = this->m_imageHeight / 2;
  }
  local_c0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.pNext._4_4_ = 1;
  createInfo.flags = 0x25;
  createInfo.imageType = this->m_srcImageWidth;
  createInfo.format = this->m_srcImageHeight;
  createInfo.extent.width = 1;
  createInfo.extent.height = 1;
  createInfo.extent.depth = 1;
  createInfo.mipLevels = 1;
  createInfo.arrayLayers = 0;
  createInfo.samples = VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  createInfo.usage = (VkImageUsageFlags)sVar7;
  createInfo._64_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,0);
  createInfo.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(&local_100,vk,device_00,(VkImageCreateInfo *)local_c0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_e0.deleter.m_deviceIface;
  data_00.object.m_internal = local_e0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_e0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_e0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_e0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_srcImage,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_100);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  srcBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar8->m_internal;
  bindImageMemory(&local_150,vki_00,vk,physicalDevice_00,device_00,
                  (VkImage)srcBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                           m_allocator,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data_01.object.m_internal = local_130.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_130.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_130.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_130.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::operator=(&this->m_memory,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_150);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
               &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,vk,
               device_00,(long)(this->m_srcImageWidth * this->m_srcImageHeight * 4),1,
               VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_198,
             (Move *)&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_198.deleter.m_deviceIface;
  data_02.object.m_internal = local_198.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_198.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_198.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_198.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_198.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_178,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_178);
  commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       pHVar9->m_internal;
  bindBufferMemory(&local_218,vki_00,vk,physicalDevice_00,device_00,
                   (VkBuffer)
                   commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                   m_internal,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_1f8.deleter.m_deviceIface;
  data_03.object.m_internal = local_1f8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1f8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_1f8.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_1f8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_1f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_1d8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_218);
  createBeginCommandBuffer(&local_280,vk,device_00,pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&local_280);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_260.deleter.m_deviceIface;
  data_04.object = local_260.object;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_260.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_260.deleter.m_device;
  data_04.deleter.m_pool.m_internal._0_4_ = (int)local_260.deleter.m_pool.m_internal;
  data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_260.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_240,data_04);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_280);
  postImageBarrier.subresourceRange.layerCount = 0x2d;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  region.imageExtent.height = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x1000;
  postImageBarrier.pNext._4_4_ = 0;
  postImageBarrier.srcAccessMask = 7;
  postImageBarrier.dstAccessMask = 6;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  postImageBarrier._32_8_ = pHVar8->m_internal;
  postImageBarrier.image.m_internal._0_4_ = 1;
  postImageBarrier.image.m_internal._4_4_ = 0;
  postImageBarrier.subresourceRange.aspectMask = 1;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  ptr = (void *)0x0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region.bufferRowLength = 1;
  region.bufferImageHeight = 0;
  region.imageSubresource.aspectMask = 0;
  region.imageSubresource.mipLevel = 1;
  region.imageSubresource.baseArrayLayer = 0;
  region.imageSubresource.layerCount = 0;
  region.imageOffset.x = 0;
  region.imageOffset.y = this->m_srcImageWidth;
  region.imageOffset.z = this->m_srcImageHeight;
  region.imageExtent.width = 1;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_1d8);
  rng.m_rnd._8_8_ = pHVar10->m_internal;
  pvVar11 = mapMemory(vk,device_00,(VkDeviceMemory)rng.m_rnd._8_8_,
                      (long)(this->m_srcImageWidth * this->m_srcImageHeight * 4));
  de::Random::Random((Random *)&data,this->m_seed);
  for (local_380 = 0; local_380 < (ulong)(long)(this->m_srcImageWidth * 4 * this->m_srcImageHeight);
      local_380 = local_380 + 1) {
    dVar3 = de::Random::getUint8((Random *)&data);
    *(deUint8 *)((long)pvVar11 + local_380) = dVar3;
  }
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_1d8);
  ::vk::flushMappedMemoryRange
            (vk,device_00,(VkDeviceMemory)pHVar10->m_internal,0,
             (long)(this->m_srcImageWidth * this->m_srcImageHeight * 4));
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_1d8);
  (*vk->_vptr_DeviceInterface[8])(vk,device_00,pHVar10->m_internal);
  de::Random::~Random((Random *)&data);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_240);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,*ppVVar12,0x10000,0x1000,0,0,0,0,0,1,&postImageBarrier.subresourceRange.layerCount);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_240);
  pVVar1 = *ppVVar12;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_178);
  dVar2 = pHVar9->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (*vk->_vptr_DeviceInterface[0x62])(vk,pVVar1,dVar2,pHVar8->m_internal,7,1,(int)&ptr);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_240);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,*ppVVar12,0x1000,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_240);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppVVar12);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xecd);
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_240);
  queueRun(vk,queue_00,*ppVVar12);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_240);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_1d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_178);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&createInfo.initialLayout);
  return;
}

Assistant:

void ImageBlitFromImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	if (m_scale == BLIT_SCALE_10)
	{
		m_srcImageWidth			= m_imageWidth;
		m_srcImageHeight		= m_imageHeight;
	}
	else if (m_scale == BLIT_SCALE_20)
	{
		m_srcImageWidth			= m_imageWidth / 2;
		m_srcImageHeight		= m_imageHeight / 2;
	}
	else
		DE_FATAL("Unsupported scale");

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_srcImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_srcImage, 0);

	{
		const vk::Unique<vk::VkBuffer>			srcBuffer		(createBuffer(vkd, device, 4 * m_srcImageWidth * m_srcImageHeight, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
		const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			preImageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkImageMemoryBarrier			postImageBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			0,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferImageCopy				region				=
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u
			}
		};

		{
			void* const	ptr	= mapMemory(vkd, device, *memory, 4 * m_srcImageWidth * m_srcImageHeight);
			de::Random	rng	(m_seed);

			{
				deUint8* const	data = (deUint8*)ptr;

				for (size_t ndx = 0; ndx < (size_t)(4 * m_srcImageWidth * m_srcImageHeight); ndx++)
					data[ndx] = rng.getUint8();
			}

			vk::flushMappedMemoryRange(vkd, device, *memory, 0, 4 * m_srcImageWidth * m_srcImageHeight);
			vkd.unmapMemory(device, *memory);
		}

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
		vkd.cmdCopyBufferToImage(*commandBuffer, *srcBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}